

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O3

void __thiscall cppcms::rpc::json_rpc_server::check_call(json_rpc_server *this)

{
  runtime_error *this_00;
  string local_40;
  
  if ((this->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"JSON-RPC Request is not assigned to class","");
  booster::runtime_error::runtime_error(this_00,&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00284840;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void json_rpc_server::check_call()
	{
		if(current_call_.get()==0)
			throw cppcms_error("JSON-RPC Request is not assigned to class");
	}